

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

int __thiscall
wabt::string_view::compare(string_view *this,size_type pos1,size_type n1,char *s,size_type n2)

{
  int iVar1;
  string_view local_50;
  string_view local_40;
  size_type local_30;
  size_type n2_local;
  char *s_local;
  size_type n1_local;
  size_type pos1_local;
  string_view *this_local;
  
  local_30 = n2;
  n2_local = (size_type)s;
  s_local = (char *)n1;
  n1_local = pos1;
  pos1_local = (size_type)this;
  local_40 = substr(this,pos1,n1);
  string_view(&local_50,(char *)n2_local,local_30);
  iVar1 = compare(&local_40,local_50);
  return iVar1;
}

Assistant:

int string_view::compare(size_type pos1,
                         size_type n1,
                         const char* s,
                         size_type n2) const {
  return substr(pos1, n1).compare(string_view(s, n2));
}